

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall Liby::io_task::io_task(io_task *this,io_task *that)

{
  io_task *that_local;
  io_task *this_local;
  
  std::shared_ptr<Liby::FileDescriptor>::shared_ptr(&this->fp_);
  this->offset_ = 0;
  this->len_ = 0;
  std::shared_ptr<Liby::Buffer>::shared_ptr(&this->buffer_);
  std::unique_ptr<std::function<void()>,std::default_delete<std::function<void()>>>::
  unique_ptr<std::default_delete<std::function<void()>>,void>
            ((unique_ptr<std::function<void()>,std::default_delete<std::function<void()>>> *)
             &this->handler_);
  std::shared_ptr<Liby::FileDescriptor>::operator=(&this->fp_,&that->fp_);
  this->offset_ = that->offset_;
  this->len_ = that->len_;
  std::shared_ptr<Liby::Buffer>::operator=(&this->buffer_,&that->buffer_);
  return;
}

Assistant:

io_task::io_task(const io_task &that) {
    fp_ = that.fp_;
    offset_ = that.offset_;
    len_ = that.len_;
    buffer_ = that.buffer_;
}